

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ogf_tools.cxx
# Opt level: O0

void __thiscall ogf_tools::process(ogf_tools *this,cl_parser *cl)

{
  bool bVar1;
  int iVar2;
  xr_ogf *pxVar3;
  xr_skl_motion_vec *this_00;
  allocator<char> local_69;
  string local_68;
  xr_ogf *local_48;
  xr_ogf *ogf;
  char *source;
  size_t num_params;
  size_t i;
  char *sg_val;
  xr_sg_type sg_type;
  target_format format;
  cl_parser *cl_local;
  ogf_tools *this_local;
  
  _sg_type = cl;
  cl_local = (cl_parser *)this;
  sg_val._4_4_ = object_tools::get_target_format(&this->super_object_tools,cl);
  if ((sg_val._4_4_ == TARGET_INFO) || (sg_val._4_4_ == TARGET_ERROR)) {
    xray_re::msg("unsupported options combination");
  }
  else {
    sg_val._0_4_ = 0;
    i = 0;
    bVar1 = cl_parser::get_string(_sg_type,"-sg",(char **)&i);
    if (bVar1) {
      iVar2 = strcmp((char *)i,"soc");
      if (iVar2 == 0) {
        sg_val._0_4_ = SOC;
      }
      else {
        iVar2 = strcmp((char *)i,"cscop");
        if (iVar2 != 0) {
          xray_re::msg("invalid `-sg` param");
          return;
        }
        sg_val._0_4_ = CSCOP;
      }
    }
    else {
      sg_val._0_4_ = SOC;
    }
    bVar1 = batch_helper::prepare_target_name
                      (&(this->super_object_tools).super_batch_helper,_sg_type);
    if (bVar1) {
      num_params = 0;
      source = (char *)cl_parser::num_params(_sg_type);
      for (; (char *)num_params != source; num_params = num_params + 1) {
        pxVar3 = (xr_ogf *)cl_parser::param(_sg_type,num_params);
        ogf = pxVar3;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_68,(char *)pxVar3,&local_69);
        pxVar3 = xray_re::xr_ogf::load_ogf(&local_68);
        std::__cxx11::string::~string((string *)&local_68);
        std::allocator<char>::~allocator(&local_69);
        local_48 = pxVar3;
        if (pxVar3 == (xr_ogf *)0x0) {
          xray_re::msg("can\'t load %s",ogf);
        }
        else {
          switch(sg_val._4_4_) {
          case TARGET_DEFAULT:
          case TARGET_OBJECT:
            object_tools::save_object
                      (&this->super_object_tools,&pxVar3->super_xr_object,(char *)ogf,
                       (xr_sg_type)sg_val);
            break;
          default:
            break;
          case TARGET_SKL:
            object_tools::save_skl
                      (&this->super_object_tools,&pxVar3->super_xr_object,(char *)ogf,_sg_type);
            break;
          case TARGET_SKLS:
            this_00 = xray_re::xr_object::motions(&pxVar3->super_xr_object);
            bVar1 = std::vector<xray_re::xr_skl_motion_*,_std::allocator<xray_re::xr_skl_motion_*>_>
                    ::empty(this_00);
            if (bVar1) {
              xray_re::msg("object has no own motions");
            }
            else {
              object_tools::save_skls
                        (&this->super_object_tools,&local_48->super_xr_object,(char *)ogf);
            }
            break;
          case TARGET_BONES:
            object_tools::save_bones(&this->super_object_tools,&pxVar3->super_xr_object,(char *)ogf)
            ;
          }
        }
        if (local_48 != (xr_ogf *)0x0) {
          (*(local_48->super_xr_object).super_xr_surface_factory._vptr_xr_surface_factory[1])();
        }
      }
    }
  }
  return;
}

Assistant:

void ogf_tools::process(const cl_parser& cl)
{
	target_format format = get_target_format(cl);
	switch (format) {
	case TARGET_INFO:
	case TARGET_ERROR:
		msg("unsupported options combination");
		return;
	default:
		break;
	}

	xr_sg_type sg_type = xr_sg_type::SOC;
	const char* sg_val = 0;
	if (!cl.get_string("-sg", sg_val)) {
		sg_type = xr_sg_type::SOC;
	}
	else if (std::strcmp(sg_val, "soc") == 0) {
		sg_type = xr_sg_type::SOC;
	}
	else if (std::strcmp(sg_val, "cscop") == 0) {
		sg_type = xr_sg_type::CSCOP;
	}
	else {
		msg("invalid `-sg` param");
		return;
	}

	if (!prepare_target_name(cl))
		return;

	for (size_t i = 0, num_params = cl.num_params(); i != num_params; ++i) {
		const char* source = cl.param(i);
		xr_ogf* ogf = xr_ogf::load_ogf(source);
		if (ogf) {
			switch (format) {
			case TARGET_DEFAULT:
			case TARGET_OBJECT:
				save_object(*ogf, source, sg_type);
				break;
			case TARGET_SKLS:
				if (ogf->motions().empty()) {
					msg("object has no own motions");
				} else {
					save_skls(*ogf, source);
				}
				break;
			case TARGET_SKL:
				save_skl(*ogf, source, cl);
				break;
			case TARGET_BONES:
				save_bones(*ogf, source);
				break;
			default:
				break;
			}
		} else {
			msg("can't load %s", source);
		}
		delete ogf;
	}
}